

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  byte bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  stbi_uc *psVar8;
  int iVar9;
  uint uVar10;
  
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  if (1 < bVar1) goto LAB_001289e4;
  bVar2 = stbi__get8(s);
  if (bVar1 == 1) {
    if ((bVar2 & 0xf7) != 1) goto LAB_001289e4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar8 = s->img_buffer;
LAB_00128ac4:
      s->img_buffer = psVar8 + 4;
    }
    else {
      psVar8 = s->img_buffer;
      iVar9 = (int)s->img_buffer_end - (int)psVar8;
      if (3 < iVar9) goto LAB_00128ac4;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar9);
    }
    bVar1 = stbi__get8(s);
    if ((0x20 < bVar1) || ((0x101018100U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) goto LAB_001289e4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar8 = s->img_buffer;
    }
    else {
      psVar8 = s->img_buffer;
      iVar9 = (int)s->img_buffer_end - (int)psVar8;
      if (iVar9 < 4) {
        s->img_buffer = s->img_buffer_end;
        (*(s->io).skip)(s->io_user_data,4 - iVar9);
        goto LAB_00128b68;
      }
    }
    s->img_buffer = psVar8 + 4;
  }
  else {
    if ((bVar2 & 0xf6) != 2) goto LAB_001289e4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar8 = s->img_buffer;
LAB_00128b43:
      s->img_buffer = psVar8 + 9;
    }
    else {
      psVar8 = s->img_buffer;
      iVar9 = (int)s->img_buffer_end - (int)psVar8;
      if (8 < iVar9) goto LAB_00128b43;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,9 - iVar9);
    }
    bVar1 = 0;
  }
LAB_00128b68:
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if (CONCAT11(sVar4,sVar3) == 0) goto LAB_001289e4;
  sVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  if (CONCAT11(sVar6,sVar5) == 0) goto LAB_001289e4;
  bVar7 = stbi__get8(s);
  stbi__get8(s);
  if (bVar1 == 0) {
    if (0xf < bVar7) {
      if ((bVar7 == 0x20) || (bVar7 == 0x18)) {
        uVar10 = (uint)(bVar7 >> 3);
      }
      else {
        if (bVar7 != 0x10) goto LAB_001289e4;
        uVar10 = (bVar2 & 0xf7) == 3 ^ 3;
      }
      goto LAB_00128c61;
    }
LAB_00128c2f:
    uVar10 = 1;
    if (bVar7 == 8) goto LAB_00128c61;
    if (bVar7 != 0xf) {
LAB_001289e4:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  else {
    if ((bVar7 != 8) && (bVar7 != 0x10)) goto LAB_001289e4;
    bVar7 = bVar1;
    if (bVar1 < 0x10) goto LAB_00128c2f;
    if ((bVar1 == 0x20) || (bVar1 == 0x18)) {
      uVar10 = (uint)(bVar1 >> 3);
      goto LAB_00128c61;
    }
    if (bVar1 != 0x10) goto LAB_001289e4;
  }
  uVar10 = 3;
LAB_00128c61:
  if (x != (int *)0x0) {
    *x = (uint)CONCAT11(sVar4,sVar3);
  }
  if (y != (int *)0x0) {
    *y = (uint)CONCAT11(sVar6,sVar5);
  }
  if (comp == (int *)0x0) {
    return 1;
  }
  *comp = uVar10;
  return 1;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}